

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O1

FieldType __thiscall HttpFieldMap::getFieldType(HttpFieldMap *this,char *field)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 1000;
  lVar3 = 0;
  do {
    iVar1 = strcasecmp(field,*(char **)((long)gFieldTypeList + lVar3));
    if (iVar1 == 0) {
      return iVar2;
    }
    iVar2 = iVar2 + 1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x178);
  return -1;
}

Assistant:

FieldMap::FieldType HttpFieldMap::getFieldType(const char *field) const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	for (int i = 0; i < kNumFields - FieldMap::kHttpFieldMapStart; ++i)
	{
		if (strcasecmp(field, gFieldTypeList[i]) == 0)
		{
			LOG("type %d, name %s",
				i+FieldMap::kHttpFieldMapStart, gFieldTypeList[i]);
			return (FieldMap::FieldType)i + FieldMap::kHttpFieldMapStart;
		}
	}
	return FieldMap::kInvalidFieldType;
}